

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.h
# Opt level: O0

void __thiscall
anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>::Surface
          (Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_> *this,
          Ref<anurbs::NurbsSurfaceGeometry<2L>_> *geometry)

{
  element_type *peVar1;
  Ref<anurbs::NurbsSurfaceGeometry<2L>_> local_78;
  Interval local_68 [2];
  Ref<anurbs::NurbsSurfaceGeometry<2L>_> local_48;
  Interval local_38;
  Ref<anurbs::NurbsSurfaceGeometry<2L>_> local_28;
  Ref<anurbs::NurbsSurfaceGeometry<2L>_> *local_18;
  Ref<anurbs::NurbsSurfaceGeometry<2L>_> *geometry_local;
  Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_> *this_local;
  
  local_18 = geometry;
  geometry_local = (Ref<anurbs::NurbsSurfaceGeometry<2L>_> *)this;
  Ref<anurbs::NurbsSurfaceGeometry<2L>_>::Ref(&local_28,geometry);
  Ref<anurbs::NurbsSurfaceGeometry<2L>_>::operator->(&local_48);
  peVar1 = std::
           __shared_ptr_access<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_48);
  (*(peVar1->super_SurfaceBase<2L>)._vptr_SurfaceBase[4])();
  Ref<anurbs::NurbsSurfaceGeometry<2L>_>::operator->(&local_78);
  peVar1 = std::
           __shared_ptr_access<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_78);
  (*(peVar1->super_SurfaceBase<2L>)._vptr_SurfaceBase[5])();
  Surface(this,&local_28,&local_38,local_68);
  std::shared_ptr<anurbs::NurbsSurfaceGeometry<2L>_>::~shared_ptr
            ((shared_ptr<anurbs::NurbsSurfaceGeometry<2L>_> *)&local_78);
  std::shared_ptr<anurbs::NurbsSurfaceGeometry<2L>_>::~shared_ptr
            ((shared_ptr<anurbs::NurbsSurfaceGeometry<2L>_> *)&local_48);
  Ref<anurbs::NurbsSurfaceGeometry<2L>_>::~Ref(&local_28);
  return;
}

Assistant:

Surface(TRef geometry) : Surface(geometry, geometry->domain_u(),
        geometry->domain_v())
    {
    }